

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::debugging_internal::ElfMemImage::SymbolIterator::Update
          (SymbolIterator *this,uint32_t increment)

{
  Elf64_Word offset;
  ElfMemImage *this_00;
  Elf64_Sym *sym;
  Elf64_Versym *pEVar1;
  char *pcVar2;
  Elf64_Verdef *pEVar3;
  void *pvVar4;
  uint32_t index;
  char *pcVar5;
  
  this_00 = (ElfMemImage *)this->image_;
  if (increment != 0 && this_00->ehdr_ == (Elf64_Ehdr *)0x0) {
    raw_log_internal::RawLog
              (kFatal,"elf_mem_image.cc",0x16f,"Check %s failed: %s",
               "image->IsPresent() || increment == 0","");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/debugging/internal/elf_mem_image.cc"
                  ,0x16f,
                  "void absl::debugging_internal::ElfMemImage::SymbolIterator::Update(uint32_t)");
  }
  if (this_00->ehdr_ != (Elf64_Ehdr *)0x0) {
    index = increment + this->index_;
    this->index_ = index;
    if (index < this_00->num_syms_) {
      sym = GetDynsym(this_00,index);
      pEVar1 = GetVersym(this_00,this->index_);
      if ((sym == (Elf64_Sym *)0x0) || (pEVar1 == (Elf64_Versym *)0x0)) {
        raw_log_internal::RawLog
                  (kFatal,"elf_mem_image.cc",0x17a,"Check %s failed: %s","symbol && version_symbol",
                   "");
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/debugging/internal/elf_mem_image.cc"
                      ,0x17a,
                      "void absl::debugging_internal::ElfMemImage::SymbolIterator::Update(uint32_t)"
                     );
      }
      pcVar2 = GetDynstr(this_00,sym->st_name);
      pcVar5 = "";
      if (sym->st_shndx != 0) {
        pEVar3 = GetVerdef(this_00,*pEVar1 & 0x7fff);
        if (pEVar3 != (Elf64_Verdef *)0x0) {
          if ((ushort)(pEVar3->vd_cnt - 3) < 0xfffe) {
            raw_log_internal::RawLog
                      (kFatal,"elf_mem_image.cc",399,"Check %s failed: %s",
                       "version_definition->vd_cnt == 1 || version_definition->vd_cnt == 2",
                       "wrong number of entries");
            __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/debugging/internal/elf_mem_image.cc"
                          ,399,
                          "void absl::debugging_internal::ElfMemImage::SymbolIterator::Update(uint32_t)"
                         );
          }
          offset._0_2_ = pEVar3[1].vd_version;
          offset._2_2_ = pEVar3[1].vd_flags;
          pcVar5 = GetVerstr(this_00,offset);
        }
      }
      (this->info_).name = pcVar2;
      (this->info_).version = pcVar5;
      pvVar4 = GetSymAddr(this_00,sym);
      (this->info_).address = pvVar4;
      (this->info_).symbol = sym;
    }
    else {
      this->index_ = this_00->num_syms_;
    }
  }
  return;
}

Assistant:

void ElfMemImage::SymbolIterator::Update(uint32_t increment) {
  const ElfMemImage *image = reinterpret_cast<const ElfMemImage *>(image_);
  ABSL_RAW_CHECK(image->IsPresent() || increment == 0, "");
  if (!image->IsPresent()) {
    return;
  }
  index_ += increment;
  if (index_ >= image->GetNumSymbols()) {
    index_ = image->GetNumSymbols();
    return;
  }
  const ElfW(Sym)    *symbol = image->GetDynsym(index_);
  const ElfW(Versym) *version_symbol = image->GetVersym(index_);
  ABSL_RAW_CHECK(symbol && version_symbol, "");
  const char *const symbol_name = image->GetDynstr(symbol->st_name);
#if defined(__NetBSD__)
  const int version_index = version_symbol->vs_vers & VERSYM_VERSION;
#else
  const ElfW(Versym) version_index = version_symbol[0] & VERSYM_VERSION;
#endif
  const ElfW(Verdef) *version_definition = nullptr;
  const char *version_name = "";
  if (symbol->st_shndx == SHN_UNDEF) {
    // Undefined symbols reference DT_VERNEED, not DT_VERDEF, and
    // version_index could well be greater than verdefnum_, so calling
    // GetVerdef(version_index) may trigger assertion.
  } else {
    version_definition = image->GetVerdef(version_index);
  }
  if (version_definition) {
    // I am expecting 1 or 2 auxiliary entries: 1 for the version itself,
    // optional 2nd if the version has a parent.
    ABSL_RAW_CHECK(
        version_definition->vd_cnt == 1 || version_definition->vd_cnt == 2,
        "wrong number of entries");
    const ElfW(Verdaux) *version_aux = image->GetVerdefAux(version_definition);
    version_name = image->GetVerstr(version_aux->vda_name);
  }
  info_.name    = symbol_name;
  info_.version = version_name;
  info_.address = image->GetSymAddr(symbol);
  info_.symbol  = symbol;
}